

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint _h;
  void *pvVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  void *pvVar16;
  uint uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  ulong uVar27;
  float *pfVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar35 [32];
  undefined1 auVar37 [64];
  float fVar45;
  float fVar56;
  float fVar57;
  float fVar58;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar70 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined4 uVar122;
  undefined1 auVar121 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar123 [16];
  Mat local_158;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  Mat *local_d0;
  Mat *local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [32];
  Allocator *local_88;
  int iStack_80;
  int iStack_7c;
  undefined8 uStack_78;
  int local_70;
  size_t local_68;
  undefined1 local_58 [32];
  undefined1 auVar36 [32];
  
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = top_blob->w;
  _h = cell_state->w;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_c8 = top_blob;
  Mat::create(&local_158,4,_h,4,opt->workspace_allocator);
  iVar22 = -100;
  if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
  goto LAB_00374a62;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88 = (Allocator *)0x0;
  iStack_80 = 0;
  iStack_7c = 0;
  uStack_78._0_4_ = 0;
  uStack_78._4_4_ = 0;
  local_70 = 0;
  if (uVar7 == _h) {
LAB_00373db5:
    if (0 < (int)uVar6) {
      uVar19 = (ulong)(int)_h;
      local_d8 = uVar19 & 0xfffffffffffffffe;
      local_e0 = (ulong)(uint)((int)_h >> 2);
      uVar20 = uVar19 & 0xfffffffffffffffc;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (ulong)_h - 1;
      auVar90 = vpshufd_avx(auVar90,0x44);
      local_58._16_16_ = auVar90;
      local_58._0_16_ = auVar90;
      local_e8 = local_e0 * 4;
      uVar27 = 0;
      local_d0 = weight_hc;
      do {
        uVar17 = ~(uint)uVar27 + uVar6;
        if (reverse == 0) {
          uVar17 = (uint)uVar27;
        }
        lVar25 = (long)(int)uVar17;
        if (0 < (int)_h >> 1) {
          uVar14 = 0;
          do {
            pfVar18 = (float *)((long)weight_xc->w * uVar14 * weight_xc->elemsize +
                               (long)weight_xc->data);
            pfVar21 = (float *)(bottom_blob->w * lVar25 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar28 = (float *)((long)bias_c->data + uVar14 * 0x20);
            fVar29 = *pfVar28;
            fVar38 = pfVar28[1];
            fVar39 = pfVar28[2];
            fVar40 = pfVar28[3];
            fVar41 = pfVar28[4];
            fVar42 = pfVar28[5];
            fVar43 = pfVar28[6];
            fVar44 = pfVar28[7];
            if ((int)uVar5 < 4) {
              fVar63 = 0.0;
              fVar71 = 0.0;
              fVar72 = 0.0;
              fVar73 = 0.0;
              fVar74 = 0.0;
              fVar75 = 0.0;
              fVar76 = 0.0;
              fVar77 = 0.0;
              auVar87 = ZEXT864(0);
              fVar45 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              fVar61 = 0.0;
              fVar62 = 0.0;
              uVar17 = 0;
            }
            else {
              fVar45 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              fVar61 = 0.0;
              fVar62 = 0.0;
              iVar22 = 3;
              auVar87 = ZEXT864(0);
              fVar63 = 0.0;
              fVar71 = 0.0;
              fVar72 = 0.0;
              fVar73 = 0.0;
              fVar74 = 0.0;
              fVar75 = 0.0;
              fVar76 = 0.0;
              fVar77 = 0.0;
              do {
                fVar1 = *pfVar21;
                fVar2 = pfVar21[1];
                fVar3 = pfVar21[2];
                fVar4 = pfVar21[3];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar38 = fVar1 * pfVar18[1] + fVar38;
                fVar39 = fVar1 * pfVar18[2] + fVar39;
                fVar40 = fVar1 * pfVar18[3] + fVar40;
                fVar41 = fVar1 * pfVar18[4] + fVar41;
                fVar42 = fVar1 * pfVar18[5] + fVar42;
                fVar43 = fVar1 * pfVar18[6] + fVar43;
                fVar44 = fVar1 + fVar44;
                fVar45 = fVar2 * pfVar18[8] + fVar45;
                fVar56 = fVar2 * pfVar18[9] + fVar56;
                fVar57 = fVar2 * pfVar18[10] + fVar57;
                fVar58 = fVar2 * pfVar18[0xb] + fVar58;
                fVar59 = fVar2 * pfVar18[0xc] + fVar59;
                fVar60 = fVar2 * pfVar18[0xd] + fVar60;
                fVar61 = fVar2 * pfVar18[0xe] + fVar61;
                fVar62 = fVar2 + fVar62;
                auVar87 = ZEXT3264(CONCAT428(fVar1 + auVar87._28_4_,
                                             CONCAT424(fVar3 * pfVar18[0x16] + auVar87._24_4_,
                                                       CONCAT420(fVar3 * pfVar18[0x15] +
                                                                 auVar87._20_4_,
                                                                 CONCAT416(fVar3 * pfVar18[0x14] +
                                                                           auVar87._16_4_,
                                                                           CONCAT412(fVar3 * pfVar18
                                                  [0x13] + auVar87._12_4_,
                                                  CONCAT48(fVar3 * pfVar18[0x12] + auVar87._8_4_,
                                                           CONCAT44(fVar3 * pfVar18[0x11] +
                                                                    auVar87._4_4_,
                                                                    fVar3 * pfVar18[0x10] +
                                                                    auVar87._0_4_))))))));
                fVar63 = fVar4 * pfVar18[0x18] + fVar63;
                fVar71 = fVar4 * pfVar18[0x19] + fVar71;
                fVar72 = fVar4 * pfVar18[0x1a] + fVar72;
                fVar73 = fVar4 * pfVar18[0x1b] + fVar73;
                fVar74 = fVar4 * pfVar18[0x1c] + fVar74;
                fVar75 = fVar4 * pfVar18[0x1d] + fVar75;
                fVar76 = fVar4 * pfVar18[0x1e] + fVar76;
                fVar77 = fVar1 + fVar77;
                pfVar21 = pfVar21 + 4;
                pfVar18 = pfVar18 + 0x20;
                iVar22 = iVar22 + 4;
                uVar17 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar86 = auVar87._0_32_;
            if ((int)uVar17 < (int)uVar5) {
              lVar23 = 0;
              do {
                fVar1 = pfVar21[lVar23];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar38 = fVar1 * pfVar18[1] + fVar38;
                fVar39 = fVar1 * pfVar18[2] + fVar39;
                fVar40 = fVar1 * pfVar18[3] + fVar40;
                fVar41 = fVar1 * pfVar18[4] + fVar41;
                fVar42 = fVar1 * pfVar18[5] + fVar42;
                fVar43 = fVar1 * pfVar18[6] + fVar43;
                fVar44 = fVar1 + fVar44;
                pfVar18 = pfVar18 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar5 - uVar17 != (int)lVar23);
            }
            pfVar18 = (float *)((long)local_d0->w * uVar14 * local_d0->elemsize +
                               (long)local_d0->data);
            pfVar28 = (float *)hidden_state->data;
            uVar17 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar1 = *pfVar28;
                fVar2 = pfVar28[1];
                fVar3 = pfVar28[2];
                fVar4 = pfVar28[3];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar38 = fVar1 * pfVar18[1] + fVar38;
                fVar39 = fVar1 * pfVar18[2] + fVar39;
                fVar40 = fVar1 * pfVar18[3] + fVar40;
                fVar41 = fVar1 * pfVar18[4] + fVar41;
                fVar42 = fVar1 * pfVar18[5] + fVar42;
                fVar43 = fVar1 * pfVar18[6] + fVar43;
                fVar44 = fVar1 + fVar44;
                fVar45 = fVar2 * pfVar18[8] + fVar45;
                fVar56 = fVar2 * pfVar18[9] + fVar56;
                fVar57 = fVar2 * pfVar18[10] + fVar57;
                fVar58 = fVar2 * pfVar18[0xb] + fVar58;
                fVar59 = fVar2 * pfVar18[0xc] + fVar59;
                fVar60 = fVar2 * pfVar18[0xd] + fVar60;
                fVar61 = fVar2 * pfVar18[0xe] + fVar61;
                fVar62 = fVar2 + fVar62;
                auVar86._0_4_ = fVar3 * pfVar18[0x10] + auVar87._0_4_;
                auVar86._4_4_ = fVar3 * pfVar18[0x11] + auVar87._4_4_;
                auVar86._8_4_ = fVar3 * pfVar18[0x12] + auVar87._8_4_;
                auVar86._12_4_ = fVar3 * pfVar18[0x13] + auVar87._12_4_;
                auVar86._16_4_ = fVar3 * pfVar18[0x14] + auVar87._16_4_;
                auVar86._20_4_ = fVar3 * pfVar18[0x15] + auVar87._20_4_;
                auVar86._24_4_ = fVar3 * pfVar18[0x16] + auVar87._24_4_;
                auVar86._28_4_ = fVar1 + auVar87._28_4_;
                auVar87 = ZEXT3264(auVar86);
                fVar63 = fVar4 * pfVar18[0x18] + fVar63;
                fVar71 = fVar4 * pfVar18[0x19] + fVar71;
                fVar72 = fVar4 * pfVar18[0x1a] + fVar72;
                fVar73 = fVar4 * pfVar18[0x1b] + fVar73;
                fVar74 = fVar4 * pfVar18[0x1c] + fVar74;
                fVar75 = fVar4 * pfVar18[0x1d] + fVar75;
                fVar76 = fVar4 * pfVar18[0x1e] + fVar76;
                fVar77 = fVar1 + fVar77;
                pfVar28 = pfVar28 + 4;
                pfVar18 = pfVar18 + 0x20;
                iVar22 = iVar22 + 4;
                uVar17 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar17 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar1 = pfVar28[lVar23];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar38 = fVar1 * pfVar18[1] + fVar38;
                fVar39 = fVar1 * pfVar18[2] + fVar39;
                fVar40 = fVar1 * pfVar18[3] + fVar40;
                fVar41 = fVar1 * pfVar18[4] + fVar41;
                fVar42 = fVar1 * pfVar18[5] + fVar42;
                fVar43 = fVar1 * pfVar18[6] + fVar43;
                fVar44 = fVar1 + fVar44;
                pfVar18 = pfVar18 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar17 != (int)lVar23);
            }
            auVar35._0_4_ = auVar86._0_4_ + fVar63 + fVar45 + fVar29;
            auVar35._4_4_ = auVar86._4_4_ + fVar71 + fVar56 + fVar38;
            auVar35._8_4_ = auVar86._8_4_ + fVar72 + fVar57 + fVar39;
            auVar35._12_4_ = auVar86._12_4_ + fVar73 + fVar58 + fVar40;
            auVar35._16_4_ = auVar86._16_4_ + fVar74 + fVar59 + fVar41;
            auVar35._20_4_ = auVar86._20_4_ + fVar75 + fVar60 + fVar42;
            auVar35._24_4_ = auVar86._24_4_ + fVar76 + fVar61 + fVar43;
            auVar35._28_4_ = auVar86._28_4_ + fVar77 + fVar62 + fVar44;
            *(undefined1 (*) [32])
             ((long)local_158.data + (long)local_158.w * uVar14 * 2 * local_158.elemsize) = auVar35;
            uVar14 = uVar14 + 1;
          } while (uVar14 != (uint)((int)_h >> 1));
        }
        uVar14 = local_d8;
        if ((uint)local_d8 != _h) {
          do {
            uVar17 = ((uint)(uVar14 >> 0x1f) & 1) + (int)uVar14;
            lVar23 = (long)(int)(((int)uVar17 >> 1) + ((int)uVar14 - (uVar17 & 0xfffffffe)));
            pfVar18 = (float *)(weight_xc->w * lVar23 * weight_xc->elemsize + (long)weight_xc->data)
            ;
            pfVar21 = (float *)(bottom_blob->w * lVar25 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar28 = (float *)((long)bias_c->data + uVar14 * 0x10);
            fVar29 = *pfVar28;
            fVar38 = pfVar28[1];
            fVar39 = pfVar28[2];
            fVar40 = pfVar28[3];
            if ((int)uVar5 < 4) {
              fVar45 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              auVar87 = ZEXT864(0);
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              uVar17 = 0;
            }
            else {
              fVar41 = 0.0;
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              iVar22 = 3;
              auVar87 = ZEXT864(0);
              fVar45 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              do {
                fVar59 = *pfVar21;
                fVar60 = pfVar21[1];
                fVar61 = pfVar21[2];
                fVar62 = pfVar21[3];
                fVar29 = fVar59 * *pfVar18 + fVar29;
                fVar38 = fVar59 * pfVar18[1] + fVar38;
                fVar39 = fVar59 * pfVar18[2] + fVar39;
                fVar40 = fVar59 * pfVar18[3] + fVar40;
                fVar45 = fVar60 * pfVar18[4] + fVar45;
                fVar56 = fVar60 * pfVar18[5] + fVar56;
                fVar57 = fVar60 * pfVar18[6] + fVar57;
                fVar58 = fVar60 * pfVar18[7] + fVar58;
                auVar87 = ZEXT1664(CONCAT412(fVar61 * pfVar18[0xb] + auVar87._12_4_,
                                             CONCAT48(fVar61 * pfVar18[10] + auVar87._8_4_,
                                                      CONCAT44(fVar61 * pfVar18[9] + auVar87._4_4_,
                                                               fVar61 * pfVar18[8] + auVar87._0_4_))
                                            ));
                fVar41 = fVar62 * pfVar18[0xc] + fVar41;
                fVar42 = fVar62 * pfVar18[0xd] + fVar42;
                fVar43 = fVar62 * pfVar18[0xe] + fVar43;
                fVar44 = fVar62 * pfVar18[0xf] + fVar44;
                pfVar21 = pfVar21 + 4;
                pfVar18 = pfVar18 + 0x10;
                iVar22 = iVar22 + 4;
                uVar17 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar78 = auVar87._0_16_;
            if ((int)uVar17 < (int)uVar5) {
              lVar24 = 0;
              do {
                fVar59 = pfVar21[lVar24];
                fVar29 = fVar59 * *pfVar18 + fVar29;
                fVar38 = fVar59 * pfVar18[1] + fVar38;
                fVar39 = fVar59 * pfVar18[2] + fVar39;
                fVar40 = fVar59 * pfVar18[3] + fVar40;
                pfVar18 = pfVar18 + 4;
                lVar24 = lVar24 + 1;
              } while (uVar5 - uVar17 != (int)lVar24);
            }
            pfVar18 = (float *)(local_d0->w * lVar23 * local_d0->elemsize + (long)local_d0->data);
            pfVar28 = (float *)hidden_state->data;
            uVar17 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar59 = *pfVar28;
                fVar60 = pfVar28[1];
                fVar61 = pfVar28[2];
                fVar62 = pfVar28[3];
                fVar29 = fVar59 * *pfVar18 + fVar29;
                fVar38 = fVar59 * pfVar18[1] + fVar38;
                fVar39 = fVar59 * pfVar18[2] + fVar39;
                fVar40 = fVar59 * pfVar18[3] + fVar40;
                fVar45 = fVar60 * pfVar18[4] + fVar45;
                fVar56 = fVar60 * pfVar18[5] + fVar56;
                fVar57 = fVar60 * pfVar18[6] + fVar57;
                fVar58 = fVar60 * pfVar18[7] + fVar58;
                auVar78._0_4_ = fVar61 * pfVar18[8] + auVar87._0_4_;
                auVar78._4_4_ = fVar61 * pfVar18[9] + auVar87._4_4_;
                auVar78._8_4_ = fVar61 * pfVar18[10] + auVar87._8_4_;
                auVar78._12_4_ = fVar61 * pfVar18[0xb] + auVar87._12_4_;
                auVar87 = ZEXT1664(auVar78);
                fVar41 = fVar62 * pfVar18[0xc] + fVar41;
                fVar42 = fVar62 * pfVar18[0xd] + fVar42;
                fVar43 = fVar62 * pfVar18[0xe] + fVar43;
                fVar44 = fVar62 * pfVar18[0xf] + fVar44;
                pfVar28 = pfVar28 + 4;
                pfVar18 = pfVar18 + 0x10;
                iVar22 = iVar22 + 4;
                uVar17 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar17 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar59 = pfVar28[lVar23];
                fVar29 = fVar59 * *pfVar18 + fVar29;
                fVar38 = fVar59 * pfVar18[1] + fVar38;
                fVar39 = fVar59 * pfVar18[2] + fVar39;
                fVar40 = fVar59 * pfVar18[3] + fVar40;
                pfVar18 = pfVar18 + 4;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar17 != (int)lVar23);
            }
            auVar30._0_4_ = auVar78._0_4_ + fVar45 + fVar41 + fVar29;
            auVar30._4_4_ = auVar78._4_4_ + fVar56 + fVar42 + fVar38;
            auVar30._8_4_ = auVar78._8_4_ + fVar57 + fVar43 + fVar39;
            auVar30._12_4_ = auVar78._12_4_ + fVar58 + fVar44 + fVar40;
            *(undefined1 (*) [16])
             ((long)local_158.data + (long)local_158.w * uVar14 * local_158.elemsize) = auVar30;
            uVar14 = uVar14 + 1;
          } while ((long)uVar14 < (long)uVar19);
        }
        pvVar26 = (void *)(lVar25 * local_c8->w * local_c8->elemsize + (long)local_c8->data);
        pvVar16 = cell_state->data;
        pvVar8 = hidden_state->data;
        if (0 < (int)local_e0) {
          lVar25 = 0;
          do {
            lVar23 = local_158.w * lVar25 * local_158.elemsize;
            auVar90 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x10);
            auVar78 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x20);
            auVar30 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x30);
            auVar50 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_158.data + lVar23),auVar90);
            auVar31 = vunpcklps_avx(auVar78,auVar30);
            auVar49 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_158.data + lVar23),auVar90);
            auVar78 = vunpckhps_avx(auVar78,auVar30);
            auVar90 = vmovlhps_avx(auVar50,auVar31);
            local_f8 = vunpckhpd_avx(auVar50,auVar31);
            auVar50 = vmovlhps_avx(auVar49,auVar78);
            auVar49 = vunpckhpd_avx(auVar49,auVar78);
            auVar79._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar79._8_4_ = auVar90._8_4_ ^ 0x80000000;
            auVar79._12_4_ = auVar90._12_4_ ^ 0x80000000;
            auVar123._8_4_ = 0x42b0c0a5;
            auVar123._0_8_ = 0x42b0c0a542b0c0a5;
            auVar123._12_4_ = 0x42b0c0a5;
            auVar90 = vminps_avx(auVar123,auVar79);
            auVar31._8_4_ = 0xc2b0c0a5;
            auVar31._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar31._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar90,auVar31);
            auVar88._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar88._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar88._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar88._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar102._0_4_ = (int)auVar88._0_4_;
            auVar102._4_4_ = (int)auVar88._4_4_;
            auVar102._8_4_ = (int)auVar88._8_4_;
            auVar102._12_4_ = (int)auVar88._12_4_;
            auVar78 = vcvtdq2ps_avx(auVar102);
            auVar90 = vcmpps_avx(auVar88,auVar78,1);
            auVar113._8_4_ = 0x3f800000;
            auVar113._0_8_ = 0x3f8000003f800000;
            auVar113._12_4_ = 0x3f800000;
            auVar90 = vandps_avx(auVar90,auVar113);
            auVar90 = vsubps_avx(auVar78,auVar90);
            auVar103._0_4_ = auVar90._0_4_ * 0.6931472;
            auVar103._4_4_ = auVar90._4_4_ * 0.6931472;
            auVar103._8_4_ = auVar90._8_4_ * 0.6931472;
            auVar103._12_4_ = auVar90._12_4_ * 0.6931472;
            auVar78 = vsubps_avx(auVar30,auVar103);
            fVar29 = auVar78._0_4_;
            fVar38 = auVar78._4_4_;
            fVar39 = auVar78._8_4_;
            fVar40 = auVar78._12_4_;
            auVar89._0_4_ = (int)auVar90._0_4_;
            auVar89._4_4_ = (int)auVar90._4_4_;
            auVar89._8_4_ = (int)auVar90._8_4_;
            auVar89._12_4_ = (int)auVar90._12_4_;
            auVar90 = vpslld_avx(auVar89,0x17);
            auVar90 = vpaddd_avx(auVar90,auVar113);
            auVar80._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar80._4_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar80._8_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar80._12_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar90._12_4_ + 1.0;
            auVar64._0_4_ = auVar49._0_4_ * -2.0;
            auVar64._4_4_ = auVar49._4_4_ * -2.0;
            auVar64._8_4_ = auVar49._8_4_ * -2.0;
            auVar64._12_4_ = auVar49._12_4_ * -2.0;
            auVar90 = vminps_avx(auVar123,auVar64);
            auVar30 = vmaxps_avx(auVar90,auVar31);
            auVar91._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar91._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar91._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar91._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar104._0_4_ = (int)auVar91._0_4_;
            auVar104._4_4_ = (int)auVar91._4_4_;
            auVar104._8_4_ = (int)auVar91._8_4_;
            auVar104._12_4_ = (int)auVar91._12_4_;
            auVar78 = vcvtdq2ps_avx(auVar104);
            auVar90 = vcmpps_avx(auVar91,auVar78,1);
            auVar90 = vandps_avx(auVar90,auVar113);
            auVar90 = vsubps_avx(auVar78,auVar90);
            auVar105._0_4_ = auVar90._0_4_ * 0.6931472;
            auVar105._4_4_ = auVar90._4_4_ * 0.6931472;
            auVar105._8_4_ = auVar90._8_4_ * 0.6931472;
            auVar105._12_4_ = auVar90._12_4_ * 0.6931472;
            auVar78 = vsubps_avx(auVar30,auVar105);
            fVar29 = auVar78._0_4_;
            fVar38 = auVar78._4_4_;
            fVar39 = auVar78._8_4_;
            fVar40 = auVar78._12_4_;
            auVar49 = vrcpps_avx(auVar80);
            auVar92._0_4_ = (int)auVar90._0_4_;
            auVar92._4_4_ = (int)auVar90._4_4_;
            auVar92._8_4_ = (int)auVar90._8_4_;
            auVar92._12_4_ = (int)auVar90._12_4_;
            auVar90 = vpslld_avx(auVar92,0x17);
            auVar90 = vpaddd_avx(auVar90,auVar113);
            auVar65._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar65._4_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar65._8_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar65._12_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar90._12_4_ + 1.0;
            auVar90 = vrcpps_avx(auVar65);
            fVar29 = auVar90._0_4_;
            fVar38 = auVar90._4_4_;
            fVar39 = auVar90._8_4_;
            fVar40 = auVar90._12_4_;
            auVar66._0_4_ = auVar65._0_4_ * (fVar29 + fVar29);
            auVar66._4_4_ = auVar65._4_4_ * (fVar38 + fVar38);
            auVar66._8_4_ = auVar65._8_4_ * (fVar39 + fVar39);
            auVar66._12_4_ = auVar65._12_4_ * (fVar40 + fVar40);
            auVar119._8_4_ = 0x40000000;
            auVar119._0_8_ = 0x4000000040000000;
            auVar119._12_4_ = 0x40000000;
            auVar90 = vsubps_avx(auVar119,auVar66);
            auVar93._0_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar90._0_4_;
            auVar93._4_4_ = fVar38 + fVar38 + -1.0 + fVar38 * auVar90._4_4_;
            auVar93._8_4_ = fVar39 + fVar39 + -1.0 + fVar39 * auVar90._8_4_;
            auVar93._12_4_ = fVar40 + fVar40 + -1.0 + fVar40 * auVar90._12_4_;
            fVar45 = auVar93._0_4_ * auVar49._0_4_;
            fVar56 = auVar93._4_4_ * auVar49._4_4_;
            fVar57 = auVar93._8_4_ * auVar49._8_4_;
            fVar58 = auVar93._12_4_ * auVar49._12_4_;
            in_ZMM12 = ZEXT1664(CONCAT412(fVar58,CONCAT48(fVar57,CONCAT44(fVar56,fVar45))));
            auVar81._0_4_ = fVar45 * auVar80._0_4_;
            auVar81._4_4_ = fVar56 * auVar80._4_4_;
            auVar81._8_4_ = fVar57 * auVar80._8_4_;
            auVar81._12_4_ = fVar58 * auVar80._12_4_;
            auVar51 = vsubps_avx(auVar93,auVar81);
            auVar46._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
            auVar46._8_4_ = local_f8._8_4_ ^ 0x80000000;
            auVar46._12_4_ = local_f8._12_4_ ^ 0x80000000;
            auVar82._8_4_ = 0x42b0c0a5;
            auVar82._0_8_ = 0x42b0c0a542b0c0a5;
            auVar82._12_4_ = 0x42b0c0a5;
            auVar90 = vminps_avx(auVar46,auVar82);
            auVar121._8_4_ = 0xc2b0c0a5;
            auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar121._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar121,auVar90);
            auVar94._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar94._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar94._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar94._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar106._0_4_ = (int)auVar94._0_4_;
            auVar106._4_4_ = (int)auVar94._4_4_;
            auVar106._8_4_ = (int)auVar94._8_4_;
            auVar106._12_4_ = (int)auVar94._12_4_;
            auVar78 = vcvtdq2ps_avx(auVar106);
            auVar90 = vcmpps_avx(auVar94,auVar78,1);
            auVar90 = vandps_avx(auVar90,auVar113);
            auVar90 = vsubps_avx(auVar78,auVar90);
            auVar107._0_4_ = auVar90._0_4_ * 0.6931472;
            auVar107._4_4_ = auVar90._4_4_ * 0.6931472;
            auVar107._8_4_ = auVar90._8_4_ * 0.6931472;
            auVar107._12_4_ = auVar90._12_4_ * 0.6931472;
            auVar78 = vsubps_avx(auVar30,auVar107);
            fVar29 = auVar78._0_4_;
            fVar38 = auVar78._4_4_;
            fVar39 = auVar78._8_4_;
            fVar40 = auVar78._12_4_;
            auVar95._0_4_ = (int)auVar90._0_4_;
            auVar95._4_4_ = (int)auVar90._4_4_;
            auVar95._8_4_ = (int)auVar90._8_4_;
            auVar95._12_4_ = (int)auVar90._12_4_;
            auVar90 = vpslld_avx(auVar95,0x17);
            auVar90 = vpaddd_avx(auVar90,auVar113);
            auVar47._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar47._4_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar47._8_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar47._12_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar90._12_4_ + 1.0;
            auVar31 = vrcpps_avx(auVar47);
            auVar90 = *(undefined1 (*) [16])((long)pvVar16 + lVar25 * 4);
            fVar38 = auVar90._0_4_ * auVar31._0_4_;
            fVar40 = auVar90._4_4_ * auVar31._4_4_;
            fVar42 = auVar90._8_4_ * auVar31._8_4_;
            fVar44 = auVar90._12_4_ * auVar31._12_4_;
            auVar48._0_4_ = auVar47._0_4_ * fVar38;
            auVar48._4_4_ = auVar47._4_4_ * fVar40;
            auVar48._8_4_ = auVar47._8_4_ * fVar42;
            auVar48._12_4_ = auVar47._12_4_ * fVar44;
            auVar46 = vsubps_avx(auVar90,auVar48);
            auVar32._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
            auVar32._8_4_ = auVar50._8_4_ ^ 0x80000000;
            auVar32._12_4_ = auVar50._12_4_ ^ 0x80000000;
            auVar90 = vminps_avx(auVar32,auVar82);
            auVar30 = vmaxps_avx(auVar121,auVar90);
            auVar96._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar96._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar96._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar96._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar108._0_4_ = (int)auVar96._0_4_;
            auVar108._4_4_ = (int)auVar96._4_4_;
            auVar108._8_4_ = (int)auVar96._8_4_;
            auVar108._12_4_ = (int)auVar96._12_4_;
            auVar78 = vcvtdq2ps_avx(auVar108);
            auVar90 = vcmpps_avx(auVar96,auVar78,1);
            auVar90 = vandps_avx(auVar90,auVar113);
            auVar90 = vsubps_avx(auVar78,auVar90);
            auVar109._0_4_ = auVar90._0_4_ * 0.6931472;
            auVar109._4_4_ = auVar90._4_4_ * 0.6931472;
            auVar109._8_4_ = auVar90._8_4_ * 0.6931472;
            auVar109._12_4_ = auVar90._12_4_ * 0.6931472;
            auVar78 = vsubps_avx(auVar30,auVar109);
            fVar29 = auVar78._0_4_;
            fVar39 = auVar78._4_4_;
            fVar41 = auVar78._8_4_;
            fVar43 = auVar78._12_4_;
            auVar97._0_4_ = (int)auVar90._0_4_;
            auVar97._4_4_ = (int)auVar90._4_4_;
            auVar97._8_4_ = (int)auVar90._8_4_;
            auVar97._12_4_ = (int)auVar90._12_4_;
            auVar90 = vpslld_avx(auVar97,0x17);
            auVar50 = vpaddd_avx(auVar90,auVar113);
            auVar33._0_4_ =
                 fVar45 + fVar38 + auVar31._0_4_ * auVar46._0_4_ + auVar49._0_4_ * auVar51._0_4_;
            auVar33._4_4_ =
                 fVar56 + fVar40 + auVar31._4_4_ * auVar46._4_4_ + auVar49._4_4_ * auVar51._4_4_;
            auVar33._8_4_ =
                 fVar57 + fVar42 + auVar31._8_4_ * auVar46._8_4_ + auVar49._8_4_ * auVar51._8_4_;
            auVar33._12_4_ =
                 fVar58 + fVar44 + auVar31._12_4_ * auVar46._12_4_ + auVar49._12_4_ * auVar51._12_4_
            ;
            auVar49._0_4_ = auVar33._0_4_ * -2.0;
            auVar49._4_4_ = auVar33._4_4_ * -2.0;
            auVar49._8_4_ = auVar33._8_4_ * -2.0;
            auVar49._12_4_ = auVar33._12_4_ * -2.0;
            auVar90 = vminps_avx(auVar49,auVar82);
            auVar67._8_4_ = 0xc2b0c0a5;
            auVar67._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar67._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar90,auVar67);
            auVar68._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar68._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar68._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar68._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar83._0_4_ = (int)auVar68._0_4_;
            auVar83._4_4_ = (int)auVar68._4_4_;
            auVar83._8_4_ = (int)auVar68._8_4_;
            auVar83._12_4_ = (int)auVar68._12_4_;
            auVar78 = vcvtdq2ps_avx(auVar83);
            auVar90 = vcmpps_avx(auVar68,auVar78,1);
            auVar90 = vandps_avx(auVar90,auVar113);
            auVar90 = vsubps_avx(auVar78,auVar90);
            auVar84._0_4_ = auVar90._0_4_ * 0.6931472;
            auVar84._4_4_ = auVar90._4_4_ * 0.6931472;
            auVar84._8_4_ = auVar90._8_4_ * 0.6931472;
            auVar84._12_4_ = auVar90._12_4_ * 0.6931472;
            auVar78 = vsubps_avx(auVar30,auVar84);
            fVar38 = auVar78._0_4_;
            fVar40 = auVar78._4_4_;
            fVar42 = auVar78._8_4_;
            fVar44 = auVar78._12_4_;
            auVar98._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar50._0_4_ + 1.0;
            auVar98._4_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar50._4_4_ + 1.0;
            auVar98._8_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar50._8_4_ + 1.0;
            auVar98._12_4_ =
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar50._12_4_ + 1.0;
            auVar69._0_4_ = (int)auVar90._0_4_;
            auVar69._4_4_ = (int)auVar90._4_4_;
            auVar69._8_4_ = (int)auVar90._8_4_;
            auVar69._12_4_ = (int)auVar90._12_4_;
            auVar90 = vpslld_avx(auVar69,0x17);
            auVar90 = vpaddd_avx(auVar90,auVar113);
            auVar50._0_4_ =
                 (fVar38 + 1.0 +
                 fVar38 * fVar38 *
                 (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                   0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar50._4_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar50._8_4_ =
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar50._12_4_ =
                 (fVar44 + 1.0 +
                 fVar44 * fVar44 *
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar90._12_4_ + 1.0;
            auVar90 = vrcpps_avx(auVar50);
            fVar29 = auVar90._0_4_;
            fVar38 = auVar90._4_4_;
            fVar39 = auVar90._8_4_;
            fVar40 = auVar90._12_4_;
            auVar51._0_4_ = auVar50._0_4_ * (fVar29 + fVar29);
            auVar51._4_4_ = auVar50._4_4_ * (fVar38 + fVar38);
            auVar51._8_4_ = auVar50._8_4_ * (fVar39 + fVar39);
            auVar51._12_4_ = auVar50._12_4_ * (fVar40 + fVar40);
            auVar110._8_4_ = 0x40000000;
            auVar110._0_8_ = 0x4000000040000000;
            auVar110._12_4_ = 0x40000000;
            auVar78 = vsubps_avx(auVar110,auVar51);
            auVar90 = vrcpps_avx(auVar98);
            auVar52._0_4_ = fVar29 + fVar29 + -1.0 + fVar29 * auVar78._0_4_;
            auVar52._4_4_ = fVar38 + fVar38 + -1.0 + fVar38 * auVar78._4_4_;
            auVar52._8_4_ = fVar39 + fVar39 + -1.0 + fVar39 * auVar78._8_4_;
            auVar52._12_4_ = fVar40 + fVar40 + -1.0 + fVar40 * auVar78._12_4_;
            fVar29 = auVar52._0_4_ * auVar90._0_4_;
            fVar38 = auVar52._4_4_ * auVar90._4_4_;
            fVar39 = auVar52._8_4_ * auVar90._8_4_;
            fVar40 = auVar52._12_4_ * auVar90._12_4_;
            auVar99._0_4_ = auVar98._0_4_ * fVar29;
            auVar99._4_4_ = auVar98._4_4_ * fVar38;
            auVar99._8_4_ = auVar98._8_4_ * fVar39;
            auVar99._12_4_ = auVar98._12_4_ * fVar40;
            auVar78 = vsubps_avx(auVar52,auVar99);
            auVar53._0_4_ = fVar29 + auVar90._0_4_ * auVar78._0_4_;
            auVar53._4_4_ = fVar38 + auVar90._4_4_ * auVar78._4_4_;
            auVar53._8_4_ = fVar39 + auVar90._8_4_ * auVar78._8_4_;
            auVar53._12_4_ = fVar40 + auVar90._12_4_ * auVar78._12_4_;
            *(undefined1 (*) [16])((long)pvVar16 + lVar25 * 4) = auVar33;
            pvVar15 = (void *)local_a8._0_8_;
            if (uVar7 == _h) {
              *(undefined1 (*) [16])((long)pvVar8 + lVar25 * 4) = auVar53;
              pvVar15 = pvVar26;
            }
            *(undefined1 (*) [16])((long)pvVar15 + lVar25 * 4) = auVar53;
            lVar25 = lVar25 + 4;
          } while (local_e8 != lVar25);
        }
        auVar90 = in_ZMM12._0_16_;
        local_b0 = (void *)local_a8._0_8_;
        local_c0 = uVar27;
        if ((uint)uVar20 != _h) {
          local_b8 = (long)local_158.w * local_158.elemsize;
          pfVar28 = (float *)((long)local_158.data + local_b8 * uVar20 + 0xc);
          uVar27 = uVar20;
          do {
            fVar29 = *pfVar28;
            local_108 = ZEXT416((uint)pfVar28[-2]);
            fVar38 = pfVar28[-1];
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            fVar39 = expf(-pfVar28[-3]);
            local_f8._0_4_ = fVar39 + 1.0;
            fVar39 = expf(-(float)local_108._0_4_);
            local_108._0_4_ = fVar39 + 1.0;
            fVar38 = expf(-fVar38);
            fVar29 = tanhf(fVar29);
            fVar29 = *(float *)((long)pvVar16 + uVar27 * 4) / (float)local_108._0_4_ +
                     fVar29 / (float)local_f8._0_4_;
            fVar39 = tanhf(fVar29);
            auVar90 = in_ZMM12._0_16_;
            fVar39 = fVar39 / (fVar38 + 1.0);
            *(float *)((long)pvVar16 + uVar27 * 4) = fVar29;
            pvVar15 = local_b0;
            if (uVar7 == _h) {
              *(float *)((long)pvVar8 + uVar27 * 4) = fVar39;
              pvVar15 = pvVar26;
            }
            *(float *)((long)pvVar15 + uVar27 * 4) = fVar39;
            uVar27 = uVar27 + 1;
            pfVar28 = (float *)((long)pfVar28 + local_b8);
          } while ((long)uVar27 < (long)uVar19);
        }
        auVar35 = _DAT_00556460;
        auVar86 = _DAT_00556440;
        auVar90 = vpcmpeqd_avx(auVar90,auVar90);
        in_ZMM12 = ZEXT1664(auVar90);
        if (0 < (int)uVar7 && uVar7 != _h) {
          pvVar16 = weight_hr->data;
          iVar22 = weight_hr->w;
          sVar9 = weight_hr->elemsize;
          uVar27 = 0;
          do {
            if ((int)_h < 1) {
              uVar122 = 0;
            }
            else {
              uVar14 = 0;
              auVar87 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar37 = auVar87;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar14;
                auVar78 = vpshufd_avx(auVar54,0x44);
                auVar70._16_16_ = auVar78;
                auVar70._0_16_ = auVar78;
                auVar10 = vorps_avx(auVar86,auVar70);
                auVar70 = vorps_avx(auVar35,auVar70);
                auVar111._0_8_ = local_58._16_8_ ^ 0x8000000000000000;
                auVar111._8_4_ = local_58._24_4_;
                auVar111._12_4_ = local_58._28_4_ ^ 0x80000000;
                auVar100._0_8_ = auVar70._16_8_ ^ 0x8000000000000000;
                auVar100._8_4_ = auVar70._24_4_;
                auVar100._12_4_ = auVar70._28_4_ ^ 0x80000000;
                auVar50 = vpcmpgtq_avx(auVar100,auVar111);
                uVar12 = local_58._0_8_;
                auVar112._0_8_ = uVar12 ^ 0x8000000000000000;
                uVar122 = local_58._8_4_;
                auVar112._8_4_ = uVar122;
                uVar17 = local_58._12_4_;
                auVar112._12_4_ = uVar17 ^ 0x80000000;
                auVar114._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
                auVar85._8_4_ = auVar70._8_4_;
                auVar114._8_4_ = auVar85._8_4_;
                auVar114._12_4_ = auVar70._12_4_ ^ 0x80000000;
                auVar78 = vpcmpgtq_avx(auVar114,auVar112);
                auVar78 = vpackssdw_avx(auVar78,auVar50);
                auVar115._0_8_ = auVar10._16_8_ ^ 0x8000000000000000;
                auVar115._8_4_ = auVar10._24_4_;
                auVar115._12_4_ = auVar10._28_4_ ^ 0x80000000;
                auVar49 = vpcmpgtq_avx(auVar115,auVar111);
                auVar116._0_8_ = uVar12 ^ 0x8000000000000000;
                auVar116._8_4_ = uVar122;
                auVar116._12_4_ = uVar17 ^ 0x80000000;
                auVar120._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
                auVar55._8_4_ = auVar10._8_4_;
                auVar120._8_4_ = auVar55._8_4_;
                auVar120._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar30 = vpcmpgtq_avx(auVar120,auVar116);
                auVar30 = vpackssdw_avx(auVar30,auVar49);
                auVar78 = vpackssdw_avx(auVar90 ^ auVar30,auVar90 ^ auVar78);
                auVar30 = vpmovsxwd_avx(auVar78);
                auVar78 = vpunpckhwd_avx(auVar78,auVar78);
                auVar118._16_16_ = auVar78;
                auVar118._0_16_ = auVar30;
                auVar11 = vmaskmovps_avx(auVar118,*(undefined1 (*) [32])
                                                   (local_a8._0_8_ + uVar14 * 4));
                auVar118 = vmaskmovps_avx(auVar118,*(undefined1 (*) [32])
                                                    ((long)pvVar16 + uVar14 * 4));
                auVar34._0_4_ = auVar11._0_4_ * auVar118._0_4_ + auVar37._0_4_;
                auVar34._4_4_ = auVar11._4_4_ * auVar118._4_4_ + auVar37._4_4_;
                auVar34._8_4_ = auVar11._8_4_ * auVar118._8_4_ + auVar37._8_4_;
                auVar34._12_4_ = auVar11._12_4_ * auVar118._12_4_ + auVar37._12_4_;
                auVar36._16_4_ = auVar11._16_4_ * auVar118._16_4_ + auVar37._16_4_;
                auVar36._0_16_ = auVar34;
                auVar36._20_4_ = auVar11._20_4_ * auVar118._20_4_ + auVar37._20_4_;
                auVar36._24_4_ = auVar11._24_4_ * auVar118._24_4_ + auVar37._24_4_;
                auVar36._28_4_ = auVar118._28_4_ + auVar37._28_4_;
                uVar14 = uVar14 + 8;
                auVar87 = ZEXT3264(auVar36);
              } while ((_h + 7 & 0xfffffff8) != uVar14);
              auVar117._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar117._8_4_ = uVar122;
              auVar117._12_4_ = uVar17 ^ 0x80000000;
              auVar85._0_8_ = auVar70._0_8_ ^ 0x8000000000000000;
              auVar85._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar78 = vpcmpgtq_avx(auVar85,auVar117);
              auVar30 = vpackssdw_avx(auVar78,auVar50);
              auVar101._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar101._8_4_ = uVar122;
              auVar101._12_4_ = uVar17 ^ 0x80000000;
              auVar55._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
              auVar55._12_4_ = auVar10._12_4_ ^ 0x80000000;
              auVar78 = vpcmpgtq_avx(auVar55,auVar101);
              auVar78 = vpackssdw_avx(auVar78,auVar49);
              auVar78 = vblendvps_avx(auVar37._0_16_,auVar34,auVar90 ^ auVar78);
              auVar30 = vblendvps_avx(auVar37._16_16_,auVar36._16_16_,auVar90 ^ auVar30);
              auVar78 = vhaddps_avx(auVar30,auVar78);
              auVar78 = vhaddps_avx(auVar78,auVar78);
              auVar78 = vhaddps_avx(auVar78,auVar78);
              uVar122 = auVar78._0_4_;
            }
            *(undefined4 *)((long)pvVar26 + uVar27 * 4) = uVar122;
            *(undefined4 *)((long)pvVar8 + uVar27 * 4) = uVar122;
            uVar27 = uVar27 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar22 * sVar9);
          } while (uVar27 != uVar7);
        }
        uVar17 = (int)local_c0 + 1;
        uVar27 = (ulong)uVar17;
      } while (uVar17 != uVar6);
    }
    iVar22 = 0;
  }
  else {
    Mat::create((Mat *)local_a8,_h,4,opt->workspace_allocator);
    iVar22 = -100;
    if (((void *)local_a8._0_8_ != (void *)0x0) && ((long)local_70 * local_68 != 0))
    goto LAB_00373db5;
  }
  piVar13 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*local_88->_vptr_Allocator[3])();
      }
    }
  }
LAB_00374a62:
  piVar13 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}